

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void * Node_AddData(node *Node,dataid Id,datatype Type,void *Data)

{
  undefined8 *puVar1;
  size_t __n;
  nodedata *pnVar2;
  nodedata *unaff_R14;
  
  if (Node != (node *)0x0) {
    __n = Node_DataSize(Node,Id,(ulong)((uint)Type & 0x3f),Data,0x2a);
    if (__n != 0) {
      puVar1 = *(undefined8 **)(*Node->VMT + 0x80);
      pnVar2 = (nodedata *)(*(code *)*puVar1)(puVar1,__n + 0x10);
      if (pnVar2 == (nodedata *)0x0) {
        unaff_R14 = (nodedata *)0x0;
      }
      else {
        unaff_R14 = pnVar2 + 1;
        memcpy(unaff_R14,Data,__n);
        pnVar2->Code = Id << 8 | Type;
        pnVar2->Next = Node->Data;
        Node->Data = pnVar2;
        if ((Type == 0x17) && (pnVar2 = unaff_R14->Next, pnVar2 != (nodedata *)0x0)) {
          if (*(int *)((long)&pnVar2->Next + 4) != -0xf21f594) {
            __assert_fail("((node*)Node)->Magic==NODE_MAGIC",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                          ,0x88,"void Node_ValidatePtr(anynode *)");
          }
          pnVar2[1].Code = pnVar2[1].Code + 1;
        }
      }
    }
    if (__n != 0) {
      return unaff_R14;
    }
  }
  return (void *)0x0;
}

Assistant:

NOINLINE void* Node_AddData(node* Node, dataid Id, datatype Type, const void* Data)
{
    if (Node)
    {
        size_t Size = Node_DataSize(Node,Id,Type&TYPE_MASK,Data,META_PARAM_UNSET); // META_PARAM_UNSET is neutral for the type
        if (Size>0)
        {
            nodedata* Ptr;
            nodecontext* p = Node_Context(Node);

            Ptr = (nodedata*)MemHeap_Alloc(p->NodeHeap,sizeof(nodedata)+Size);
            if (!Ptr)
            {
                return NULL;
            }

            // Data list order is important. Evaluating TYPE_EXPRSTRING needs to be done in the order it was added
            // This function reverses the order, but we also use Node_Copy with templates so the final order it correct (hackish...)

            memcpy(NodeData_Data(Ptr),Data,Size);
            Ptr->Code = (Id<<DYNDATA_SHIFT)|Type;
            Ptr->Next = Node->Data;
            Node->Data = Ptr;

            if (Type == TYPE_NODE_REF && *(node**)NodeData_Data(Ptr))
                Node_AddRef(*(node**)NodeData_Data(Ptr));

            return NodeData_Data(Ptr);
        }
    }
    return NULL;
}